

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *__ptr;
  int iVar1;
  int *c;
  byte type2;
  int *piVar2;
  long lVar3;
  uint8_t uVar4;
  art_iterator_t *iterator;
  uint8_t typecode2;
  art_iterator_t it2;
  art_iterator_t it1;
  uint8_t local_149 [9];
  art_iterator_t local_140;
  art_iterator_t local_b8;
  
  art_init_iterator(&local_b8,&r1->art,true);
  art_init_iterator(&local_140,&r2->art,true);
  if (local_b8.value != (art_val_t *)0x0) {
    do {
      iterator = &local_b8;
      if (local_140.value != (art_val_t *)0x0) {
        iVar1 = art_compare_keys(local_b8.key,local_140.key);
        __ptr = local_b8.value;
        if (iVar1 == 0) {
          piVar2 = *(int **)(local_b8.value[1].key + 2);
          type2 = local_140.value[1].key[0];
          if (local_b8.value[1].key[0] != 4) {
            if (type2 == 4) {
              type2 = *(byte *)((long)*(container_t **)(local_140.value[1].key + 2) + 8);
            }
            local_149[1] = '\0';
            local_149[2] = '\0';
            local_149[3] = '\0';
            local_149[4] = '\0';
            local_149[5] = '\0';
            local_149[6] = '\0';
            local_149[7] = '\0';
            local_149[8] = '\0';
            (*(code *)(&DAT_0012d608 +
                      *(int *)(&DAT_0012d608 +
                              (ulong)(((uint)type2 + (uint)local_b8.value[1].key[0] * 4) - 5) * 4)))
                      ();
            return;
          }
          c = (int *)container_andnot(piVar2,'\x04',*(container_t **)(local_140.value[1].key + 2),
                                      type2,local_149);
          if (c != piVar2) {
            container_free(piVar2,'\x04');
            *(int **)(__ptr[1].key + 2) = c;
            __ptr[1].key[0] = local_149[0];
          }
          piVar2 = c;
          uVar4 = local_149[0];
          if (local_149[0] == '\x04') {
            uVar4 = (uint8_t)c[2];
            piVar2 = *(int **)c;
          }
          iVar1 = *piVar2;
          if ((uVar4 == '\x03') || (uVar4 == '\x02')) {
            if (0 < iVar1) {
LAB_001080b2:
              art_iterator_next(&local_b8);
              goto LAB_001080ba;
            }
          }
          else if (iVar1 != 0) {
            if (iVar1 != -1) goto LAB_001080b2;
            lVar3 = 0;
            do {
              if (*(long *)(*(long *)(piVar2 + 2) + lVar3 * 8) != 0) goto LAB_001080b2;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0x400);
          }
          container_free(c,local_149[0]);
          art_iterator_erase(&r1->art,&local_b8);
          roaring_free(__ptr);
        }
        else if (iVar1 < 0) goto LAB_001080bd;
LAB_001080ba:
        iterator = &local_140;
      }
LAB_001080bd:
      art_iterator_next(iterator);
    } while (local_b8.value != (art_val_t *)0x0);
  }
  return;
}

Assistant:

void roaring64_bitmap_andnot_inplace(roaring64_bitmap_t *r1,
                                     const roaring64_bitmap_t *r2) {
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> it1++
        // 2. it1_present &&  it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                container_t *container1 = leaf1->container;
                uint8_t typecode1 = leaf1->typecode;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_andnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                    if (container2 != container1) {
                        // We only free when doing container_andnot, not
                        // container_iandnot, as iandnot frees the original
                        // internally.
                        container_free(container1, typecode1);
                    }
                } else {
                    container2 = container_iandnot(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != container1) {
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }

                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&r1->art, &it1);
                    free_leaf(leaf1);
                } else {
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
}